

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

Am_Object find_palette_for_command
                    (Am_Object *main_cmd,Am_Value *current_value,Am_Object *script_window)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Object *in_RCX;
  Am_Value local_68;
  ushort local_58;
  undefined1 local_55;
  Am_Object local_48;
  Am_Object undo_handler;
  Am_Object undo_db;
  Am_Am_Slot_Key slot;
  Am_Value *slot_key_value;
  Am_Object *script_window_local;
  Am_Value *current_value_local;
  Am_Object *main_cmd_local;
  Am_Object *palette;
  
  pAVar2 = Am_Object::Peek((Am_Object *)current_value,0x19c,0);
  Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&undo_db.data + 6),0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&undo_db.data + 6),pAVar2);
  }
  else {
    Am_Am_Slot_Key::operator=((Am_Am_Slot_Key *)((long)&undo_db.data + 6),0);
  }
  Am_Object::Get_Object(&undo_handler,(Am_Slot_Key)in_RCX,(ulong)Am_UNDO_MENU_OF_COMMANDS);
  pAVar2 = Am_Object::Get(&undo_handler,Am_UNDO_HANDLER_TO_DISPLAY,0);
  Am_Object::Am_Object(&local_48,pAVar2);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"searching for palette for undo ");
    poVar3 = operator<<(poVar3,&local_48);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = operator<<(poVar3,&undo_handler);
    poVar3 = std::operator<<(poVar3," from ");
    poVar3 = operator<<(poVar3,in_RCX);
    poVar3 = std::operator<<(poVar3," slot ");
    poVar3 = operator<<(poVar3,(Am_Am_Slot_Key *)((long)&undo_db.data + 6));
    poVar3 = std::operator<<(poVar3," value ");
    poVar3 = operator<<(poVar3,(Am_Value *)script_window);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  }
  local_55 = 0;
  local_58 = undo_db.data._6_2_;
  Am_Value::Am_Value(&local_68,(Am_Value *)script_window);
  Am_Find_Palette_For(main_cmd,(Am_Am_Slot_Key)(Am_Slot_Key)&local_48,(Am_Value *)(ulong)local_58);
  Am_Value::~Am_Value(&local_68);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"  found  ");
    poVar3 = operator<<(poVar3,main_cmd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  }
  local_55 = 1;
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&undo_handler);
  return (Am_Object)(Am_Object_Data *)main_cmd;
}

Assistant:

Am_Object
find_palette_for_command(Am_Object &main_cmd, Am_Value &current_value,
                         Am_Object &script_window)
{
  const Am_Value& slot_key_value = main_cmd.Peek(Am_SLOT_FOR_VALUE);
  Am_Am_Slot_Key slot;
  if (!slot_key_value.Valid())
    slot = 0;
  else
    slot = slot_key_value;
  Am_Object undo_db = script_window.Get_Object(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object undo_handler = undo_db.Get(Am_UNDO_HANDLER_TO_DISPLAY);
  if (am_sdebug)
    std::cout << "searching for palette for undo " << undo_handler << " from "
              << undo_db << " from " << script_window << " slot " << slot
              << " value " << current_value << std::endl
              << std::flush;
  Am_Object palette = Am_Find_Palette_For(undo_handler, slot, current_value);
  if (am_sdebug)
    std::cout << "  found  " << palette << std::endl << std::flush;
  return palette;
}